

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract2.c
# Opt level: O2

int archive_read_extract2(archive *_a,archive_entry *entry,archive *ad)

{
  uint uVar1;
  uint uVar2;
  wchar_t wVar3;
  int error_number;
  la_int64_t lVar4;
  archive_read_extract *paVar5;
  la_ssize_t lVar6;
  char *pcVar7;
  uint uVar8;
  size_t local_48;
  void *buff;
  int64_t offset;
  
  if (*(int *)&_a[1].vtable != 0) {
    archive_write_disk_set_skip_file
              (ad,*(la_int64_t *)&_a[1].archive_format,(la_int64_t)_a[1].archive_format_name);
  }
  uVar1 = archive_write_header(ad,entry);
  if (uVar1 != 0) {
    if ((int)uVar1 < -0x13) {
      uVar1 = 0xffffffec;
    }
    archive_copy_error(_a,ad);
    goto LAB_00124bd1;
  }
  wVar3 = archive_entry_size_is_set(entry);
  if (wVar3 == L'\0') {
LAB_00124c2f:
    paVar5 = __archive_read_get_extract((archive_read *)_a);
    if (paVar5 == (archive_read_extract *)0x0) {
      uVar1 = 0xffffffe2;
      goto LAB_00124bd1;
    }
    while( true ) {
      uVar1 = archive_read_data_block(_a,&buff,&local_48,&offset);
      if (uVar1 != 0) break;
      lVar6 = archive_write_data_block(ad,buff,local_48,offset);
      uVar1 = (uint)lVar6;
      if ((int)uVar1 < 0) {
        if (uVar1 < 0xffffffed) {
          uVar1 = 0xffffffec;
        }
        error_number = archive_errno(ad);
        pcVar7 = archive_error_string(ad);
        archive_set_error(_a,error_number,"%s",pcVar7);
        goto LAB_00124bd1;
      }
      if (paVar5->extract_progress != (_func_void_void_ptr *)0x0) {
        (*paVar5->extract_progress)(paVar5->extract_progress_user_data);
      }
    }
    if (uVar1 != 1) goto LAB_00124bd1;
  }
  else {
    lVar4 = archive_entry_size(entry);
    if (0 < lVar4) goto LAB_00124c2f;
  }
  uVar1 = 0;
LAB_00124bd1:
  uVar2 = archive_write_finish_entry(ad);
  if (uVar1 == 0 && uVar2 != 0) {
    archive_copy_error(_a,ad);
  }
  uVar8 = 0xffffffec;
  if (-0x14 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if ((int)uVar1 <= (int)uVar8) {
    uVar8 = uVar1;
  }
  return uVar8;
}

Assistant:

int
archive_read_extract2(struct archive *_a, struct archive_entry *entry,
    struct archive *ad)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r, r2;

	/* Set up for this particular entry. */
	if (a->skip_file_set)
		archive_write_disk_set_skip_file(ad,
		    a->skip_file_dev, a->skip_file_ino);
	r = archive_write_header(ad, entry);
	if (r < ARCHIVE_WARN)
		r = ARCHIVE_WARN;
	if (r != ARCHIVE_OK)
		/* If _write_header failed, copy the error. */
 		archive_copy_error(&a->archive, ad);
	else if (!archive_entry_size_is_set(entry) || archive_entry_size(entry) > 0)
		/* Otherwise, pour data into the entry. */
		r = copy_data(_a, ad);
	r2 = archive_write_finish_entry(ad);
	if (r2 < ARCHIVE_WARN)
		r2 = ARCHIVE_WARN;
	/* Use the first message. */
	if (r2 != ARCHIVE_OK && r == ARCHIVE_OK)
		archive_copy_error(&a->archive, ad);
	/* Use the worst error return. */
	if (r2 < r)
		r = r2;
	return (r);
}